

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSCrolling.h
# Opt level: O2

void __thiscall
chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
ConstraintsFetch_react
          (ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
           *this,double factor)

{
  ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
  ConstraintsFetch_react
            (&this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>,
             factor);
  (this->react_torque).m_data[0] =
       factor * (this->Rx).
                super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                .super_ChConstraint.l_i;
  (this->react_torque).m_data[1] =
       factor * (this->Ru).
                super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                .super_ChConstraint.l_i;
  (this->react_torque).m_data[2] =
       factor * (this->Rv).
                super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                .super_ChConstraint.l_i;
  return;
}

Assistant:

virtual void ConstraintsFetch_react(double factor) override {
        // base behaviour too
        ChContactNSC<Ta, Tb>::ConstraintsFetch_react(factor);

        // From constraints to react torque:
        react_torque.x() = Rx.Get_l_i() * factor;
        react_torque.y() = Ru.Get_l_i() * factor;
        react_torque.z() = Rv.Get_l_i() * factor;
    }